

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

void Unr_ManSetup_rec(Unr_Man_t *p,int iObj,int iTent,Vec_Int_t *vRoots)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots_local;
  int iTent_local;
  int iObj_local;
  Unr_Man_t *p_local;
  
  iVar2 = Vec_IntEntry(p->vTents,iObj);
  if (iVar2 < 0) {
    Vec_IntWriteEntry(p->vTents,iObj,iTent);
    pGVar4 = Gia_ManObj(p->pGia,iObj);
    iVar2 = Gia_ObjIsAnd(pGVar4);
    if ((iVar2 != 0) || (iVar2 = Gia_ObjIsCo(pGVar4), iVar2 != 0)) {
      iVar2 = Gia_ObjFaninId0(pGVar4,iObj);
      Unr_ManSetup_rec(p,iVar2,iTent,vRoots);
      pVVar1 = p->vRanks;
      iVar3 = Vec_IntEntry(p->vTents,iVar2);
      iVar3 = Abc_MaxInt(0,(iTent - iVar3) + -1);
      Vec_IntWriteMaxEntry(pVVar1,iVar2,iVar3);
    }
    iVar2 = Gia_ObjIsAnd(pGVar4);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsRo(p->pGia,pGVar4);
      if (iVar2 != 0) {
        p_00 = p->pGia;
        pGVar4 = Gia_ObjRoToRi(p->pGia,pGVar4);
        iVar2 = Gia_ObjId(p_00,pGVar4);
        Vec_IntPush(vRoots,iVar2);
        Vec_IntWriteMaxEntry(p->vRanks,iVar2,0);
      }
    }
    else {
      iVar2 = Gia_ObjFaninId1(pGVar4,iObj);
      Unr_ManSetup_rec(p,iVar2,iTent,vRoots);
      pVVar1 = p->vRanks;
      iVar3 = Vec_IntEntry(p->vTents,iVar2);
      iVar3 = Abc_MaxInt(0,(iTent - iVar3) + -1);
      Vec_IntWriteMaxEntry(pVVar1,iVar2,iVar3);
    }
    Vec_IntPush(p->vOrder,iObj);
  }
  return;
}

Assistant:

void Unr_ManSetup_rec( Unr_Man_t * p, int iObj, int iTent, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    int iFanin;
    if ( Vec_IntEntry(p->vTents, iObj) >= 0 )
        return;
    Vec_IntWriteEntry(p->vTents, iObj, iTent);
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId0(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId1(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        Vec_IntPush( vRoots, (iFanin = Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj))) );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, 0 );
    }
    Vec_IntPush( p->vOrder, iObj );
}